

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

int Abc_SopCheck(char *pSop,int nFanins)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  size_t __size;
  char *pcVar7;
  
  if (*pSop == '\0') {
    iVar6 = 1;
  }
  else {
    bVar4 = false;
    bVar3 = false;
    do {
      lVar5 = -1;
      pSop = pSop + 2;
      do {
        pcVar7 = pSop;
        lVar5 = lVar5 + 1;
        pSop = pcVar7 + 1;
      } while (pcVar7[-2] != ' ');
      if (nFanins != lVar5) {
        fprintf(_stdout,
                "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n"
                ,lVar5,nFanins);
        return 0;
      }
      bVar1 = pcVar7[-1];
      bVar2 = bVar3;
      if (bVar1 < 0x6e) {
        bVar2 = true;
        if (bVar1 != 0x30) {
          if (bVar1 != 0x31) goto LAB_001ee08b;
          bVar4 = true;
          bVar2 = bVar3;
        }
      }
      else if ((bVar1 != 0x6e) && (bVar1 != 0x78)) {
LAB_001ee08b:
        fprintf(_stdout,
                "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n",
                (ulong)(uint)(int)(char)bVar1,nFanins);
        return 0;
      }
      if (*pcVar7 != '\n') {
        pcVar7 = "Abc_SopCheck: SOP has a cube without new line in the end.\n";
        __size = 0x3a;
        goto LAB_001ee07b;
      }
      bVar3 = bVar2;
    } while (*pSop != '\0');
    iVar6 = 1;
    if (bVar4 && bVar2) {
      pcVar7 = "Abc_SopCheck: SOP has cubes in both phases.\n";
      __size = 0x2c;
LAB_001ee07b:
      fwrite(pcVar7,__size,1,_stdout);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int Abc_SopCheck( char * pSop, int nFanins )
{
    char * pCubes, * pCubesOld;
    int fFound0 = 0, fFound1 = 0;

    // check the logic function of the node
    for ( pCubes = pSop; *pCubes; pCubes++ )
    {
        // get the end of the next cube
        for ( pCubesOld = pCubes; *pCubes != ' '; pCubes++ );
        // compare the distance
        if ( pCubes - pCubesOld != nFanins )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a mismatch between its cover size (%d) and its fanin number (%d).\n",
                (int)(ABC_PTRDIFF_T)(pCubes - pCubesOld), nFanins );
            return 0;
        }
        // check the output values for this cube
        pCubes++;
        if ( *pCubes == '0' )
            fFound0 = 1;
        else if ( *pCubes == '1' )
            fFound1 = 1;
        else if ( *pCubes != 'x' && *pCubes != 'n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a strange character (%c) in the output part of its cube.\n", *pCubes );
            return 0;
        }
        // check the last symbol (new line)
        pCubes++;
        if ( *pCubes != '\n' )
        {
            fprintf( stdout, "Abc_SopCheck: SOP has a cube without new line in the end.\n" );
            return 0;
        }
    }
    if ( fFound0 && fFound1 )
    {
        fprintf( stdout, "Abc_SopCheck: SOP has cubes in both phases.\n" );
        return 0;
    }
    return 1;
}